

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::addRows(HighsSparseMatrix *this,HighsSparseMatrix *new_rows,int8_t *in_partition)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  int *piVar1;
  uint uVar2;
  MatrixFormat MVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  uint uVar10;
  HighsInt HVar11;
  ulong uVar12;
  ulong uVar13;
  HighsInt start_col_plus_1;
  int iVar14;
  vector<double,_std::allocator<double>_> *this_02;
  long lVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  MatrixFormat MVar20;
  long lVar21;
  size_type __new_size;
  vector<int,_std::allocator<int>_> save_p_end;
  _Vector_base<int,_std::allocator<int>_> local_58;
  value_type_conflict2 local_34;
  
  uVar2 = new_rows->num_row_;
  __new_size = (size_type)(int)uVar2;
  uVar10 = numNz(new_rows);
  if (__new_size == 0) {
    return;
  }
  MVar3 = this->format_;
  uVar18 = this->num_col_;
  iVar4 = this->num_row_;
  HVar11 = numNz(this);
  MVar20 = MVar3;
  if (HVar11 < (int)uVar10 && MVar3 == kColwise) {
    ensureRowwise(this);
    MVar20 = this->format_;
  }
  iVar14 = uVar10 + HVar11;
  if ((MVar20 & ~kColwise) == kRowwise) {
    this_00 = &this->start_;
    std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(int)(iVar4 + uVar2 + 1));
    uVar16 = 0;
    if (0 < (int)uVar2) {
      uVar16 = (ulong)uVar2;
    }
    piVar5 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    if (uVar10 == 0) {
      for (; uVar16 != uVar13; uVar13 = uVar13 + 1) {
        piVar5[(long)iVar4 + uVar13] = HVar11;
      }
    }
    else {
      for (; uVar16 != uVar13; uVar13 = uVar13 + 1) {
        piVar5[(long)iVar4 + uVar13] =
             (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar13] + HVar11;
      }
    }
    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[(int)(iVar4 + uVar2)] = iVar14;
    if ((int)uVar10 < 1) goto LAB_00360f14;
    this_01 = &this->index_;
    std::vector<int,_std::allocator<int>_>::resize(this_01,(long)iVar14);
    this_02 = &this->value_;
    std::vector<double,_std::allocator<double>_>::resize(this_02,(long)iVar14);
    if (MVar3 != kRowwisePartitioned) {
      piVar5 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (new_rows->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar16 = 0; uVar10 != uVar16; uVar16 = uVar16 + 1) {
        piVar6[(long)HVar11 + uVar16] = piVar5[uVar16];
        pdVar9[(long)HVar11 + uVar16] = pdVar8[uVar16];
      }
      goto LAB_00360f14;
    }
    uVar13 = 0;
    uVar16 = 0;
    if (0 < (int)uVar2) {
      uVar13 = (ulong)uVar2;
    }
    while (uVar12 = uVar16, uVar12 != uVar13) {
      piVar5 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar15 = (long)piVar5[uVar12]; uVar16 = uVar12 + 1, lVar15 < piVar5[uVar12 + 1];
          lVar15 = lVar15 + 1) {
        iVar14 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15];
        if (in_partition[iVar14] != '\0') {
          iVar17 = piVar6[uVar12 + (long)iVar4];
          piVar7[iVar17] = iVar14;
          pdVar8[iVar17] =
               (new_rows->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15];
          piVar1 = piVar6 + uVar12 + (long)iVar4;
          *piVar1 = *piVar1 + 1;
        }
      }
    }
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&local_58,__new_size);
    piVar5 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
      iVar14 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16] + HVar11;
      piVar5[(long)iVar4 + uVar16] = iVar14;
      piVar6[(long)iVar4 + uVar16] = iVar14;
      local_58._M_impl.super__Vector_impl_data._M_start[uVar16] = iVar14;
    }
    uVar16 = 0;
    while (uVar12 = uVar16, uVar12 != uVar13) {
      piVar5 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar15 = (long)piVar5[uVar12]; uVar16 = uVar12 + 1, lVar15 < piVar5[uVar12 + 1];
          lVar15 = lVar15 + 1) {
        iVar14 = (new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15];
        if (in_partition[iVar14] == '\0') {
          iVar17 = piVar6[uVar12 + (long)iVar4];
          piVar7[iVar17] = iVar14;
          pdVar8[iVar17] =
               (new_rows->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15];
          piVar1 = piVar6 + uVar12 + (long)iVar4;
          *piVar1 = *piVar1 + 1;
        }
      }
    }
    piVar5 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
      piVar5[(long)iVar4 + uVar16] = local_58._M_impl.super__Vector_impl_data._M_start[uVar16];
    }
  }
  else {
    if (uVar10 == 0) goto LAB_00360f14;
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              ((vector<int,_std::allocator<int>_> *)&local_58,(long)(int)uVar18,&local_34);
    uVar13 = 0;
    uVar16 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar16 = uVar13;
    }
    for (; uVar16 != uVar13; uVar13 = uVar13 + 1) {
      local_58._M_impl.super__Vector_impl_data._M_start
      [(new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[uVar13]] =
           local_58._M_impl.super__Vector_impl_data._M_start
           [(new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13]] + 1;
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->index_,(long)iVar14);
    std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar14);
    piVar5 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = (ulong)uVar18;
    while (0 < (int)uVar16) {
      uVar13 = uVar16 - 1;
      iVar17 = iVar14 - local_58._M_impl.super__Vector_impl_data._M_start[uVar13];
      lVar15 = (long)piVar5[uVar16];
      piVar6 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar19 = 0; (long)piVar5[uVar13] < lVar15 + lVar19; lVar19 = lVar19 + -1) {
        piVar6[(long)iVar17 + lVar19 + -1] = piVar6[lVar15 + lVar19 + -1];
        pdVar8[(long)iVar17 + lVar19 + -1] = pdVar8[lVar15 + lVar19 + -1];
      }
      piVar5[uVar16] = iVar14;
      uVar16 = uVar13;
      iVar14 = iVar17 + (int)lVar19;
    }
    uVar16 = 0;
    uVar13 = 0;
    if (0 < (int)uVar2) {
      uVar13 = (ulong)uVar2;
    }
    for (; uVar16 != uVar13; uVar16 = uVar16 + 1) {
      piVar5 = (new_rows->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = uVar10;
      if ((long)uVar16 < (long)(__new_size - 1)) {
        uVar18 = piVar5[uVar16 + 1];
      }
      piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar15 = (long)piVar5[uVar16]; lVar15 < (int)uVar18; lVar15 = lVar15 + 1) {
        lVar19 = (long)(new_rows->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar15];
        lVar21 = (long)piVar6[lVar19 + 1] -
                 (long)local_58._M_impl.super__Vector_impl_data._M_start[lVar19];
        local_58._M_impl.super__Vector_impl_data._M_start[lVar19] =
             local_58._M_impl.super__Vector_impl_data._M_start[lVar19] + -1;
        piVar7[lVar21] = (int)uVar16 + iVar4;
        pdVar8[lVar21] =
             (new_rows->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar15];
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
LAB_00360f14:
  this->num_row_ = this->num_row_ + uVar2;
  return;
}

Assistant:

void HighsSparseMatrix::addRows(const HighsSparseMatrix new_rows,
                                const int8_t* in_partition) {
  assert(new_rows.isRowwise());
  const HighsInt num_new_row = new_rows.num_row_;
  const HighsInt num_new_nz = new_rows.numNz();
  const vector<HighsInt>& new_matrix_start = new_rows.start_;
  const vector<HighsInt>& new_matrix_index = new_rows.index_;
  const vector<double>& new_matrix_value = new_rows.value_;

  assert(this->formatOk());
  // Adding rows to a row-wise partitioned matrix needs the
  // partition information
  const bool partitioned = this->format_ == MatrixFormat::kRowwisePartitioned;
  if (partitioned) {
    assert(1 == 0);
    assert(in_partition != NULL);
  }
  assert(num_new_row >= 0);
  assert(num_new_nz >= 0);
  if (num_new_row == 0) {
    // No rows are being added, so check that no nonzeros are being
    // added
    assert(num_new_nz == 0);
    return;
  }
  // Adding a positive number of rows to a matrix
  if (num_new_nz) {
    // Nonzeros are being added, so ensure that non-null data are
    // being passed
    assert(!new_matrix_start.empty());
    assert(!new_matrix_index.empty());
    assert(!new_matrix_value.empty());
  }
  HighsInt num_col = this->num_col_;
  HighsInt num_row = this->num_row_;
  HighsInt num_nz = this->numNz();
  // Check that nonzeros aren't being appended to a matrix with no columns
  assert(num_new_nz <= 0 || num_col > 0);

  if (this->isColwise()) {
    // Matrix is currently a standard col-wise matrix, so flip
    // row-wise if there are more new nonzeros than current nonzeros
    if (num_new_nz > num_nz) this->ensureRowwise();
  }
  // Determine the new number of rows and nonzeros in the matrix
  HighsInt new_num_nz = num_nz + num_new_nz;
  HighsInt new_num_row = num_row + num_new_row;

  if (this->isRowwise()) {
    // Matrix is row-wise
    this->start_.resize(new_num_row + 1);
    // Append the starts of the new rows
    if (num_new_nz) {
      // Nontrivial number of nonzeros being added, so use new_matrix_start
      for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++)
        this->start_[num_row + iNewRow] = num_nz + new_matrix_start[iNewRow];
    } else {
      // No nonzeros being added, so new_matrix_start may be NULL, but entries
      // of zero are implied.
      for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++)
        this->start_[num_row + iNewRow] = num_nz;
    }
    this->start_[new_num_row] = new_num_nz;
    if (num_new_nz > 0) {
      // Adding a non-trivial matrix: resize the matrix arrays accordingly
      this->index_.resize(new_num_nz);
      this->value_.resize(new_num_nz);
      // Copy in the new indices and values
      if (partitioned) {
        // Insert the entries in the partition
        assert(1 == 0);
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
          HighsInt iRow = num_row + iNewRow;
          for (HighsInt iNewEl = new_matrix_start[iNewRow];
               iNewEl < new_matrix_start[iNewRow + 1]; iNewEl++) {
            HighsInt iCol = new_matrix_index[iNewEl];
            if (in_partition[iCol]) {
              HighsInt iEl = this->start_[iRow];
              this->index_[iEl] = new_matrix_index[iNewEl];
              this->value_[iEl] = new_matrix_value[iNewEl];
              this->start_[iRow]++;
            }
          }
        }
        // Use the incremented starts to initialise p_end, save these
        // values and reset the starts
        vector<HighsInt> save_p_end;
        save_p_end.resize(num_new_row);
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
          HighsInt iRow = num_row + iNewRow;
          this->start_[iRow] = num_nz + new_matrix_start[iNewRow];
          this->p_end_[iRow] = this->start_[iRow];
          save_p_end[iNewRow] = this->p_end_[iRow];
        }
        // Insert the entries not in the partition
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
          HighsInt iRow = num_row + iNewRow;
          for (HighsInt iNewEl = new_matrix_start[iNewRow];
               iNewEl < new_matrix_start[iNewRow + 1]; iNewEl++) {
            HighsInt iCol = new_matrix_index[iNewEl];
            if (!in_partition[iCol]) {
              HighsInt iEl = this->p_end_[iRow];
              this->index_[iEl] = new_matrix_index[iNewEl];
              this->value_[iEl] = new_matrix_value[iNewEl];
              this->p_end_[iRow]++;
            }
          }
        }
        // Reset p_end using the saved values
        for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++)
          this->p_end_[num_row + iNewRow] = save_p_end[iNewRow];
      } else {
        for (HighsInt iNewEl = 0; iNewEl < num_new_nz; iNewEl++) {
          this->index_[num_nz + iNewEl] = new_matrix_index[iNewEl];
          this->value_[num_nz + iNewEl] = new_matrix_value[iNewEl];
        }
      }
    }
  } else {
    // Storing the matrix column-wise, so have to insert the new rows
    assert(this->isColwise());
    if (num_new_nz) {
      vector<HighsInt> length;
      length.assign(num_col, 0);
      for (HighsInt iEl = 0; iEl < num_new_nz; iEl++)
        length[new_matrix_index[iEl]]++;
      // Determine the new number of nonzeros and resize the column-wise matrix
      // arrays
      this->index_.resize(new_num_nz);
      this->value_.resize(new_num_nz);
      // Append the new rows
      // Shift the existing columns to make space for the new entries
      HighsInt new_iEl = new_num_nz;
      for (HighsInt iCol = num_col - 1; iCol >= 0; iCol--) {
        HighsInt start_col_plus_1 = new_iEl;
        new_iEl -= length[iCol];
        for (HighsInt iEl = this->start_[iCol + 1] - 1;
             iEl >= this->start_[iCol]; iEl--) {
          new_iEl--;
          this->index_[new_iEl] = this->index_[iEl];
          this->value_[new_iEl] = this->value_[iEl];
        }
        this->start_[iCol + 1] = start_col_plus_1;
      }
      assert(new_iEl == 0);
      // Insert the new entries
      for (HighsInt iNewRow = 0; iNewRow < num_new_row; iNewRow++) {
        HighsInt first_el = new_matrix_start[iNewRow];
        HighsInt last_el =
            (iNewRow < num_new_row - 1 ? new_matrix_start[iNewRow + 1]
                                       : num_new_nz);
        for (HighsInt iEl = first_el; iEl < last_el; iEl++) {
          HighsInt iCol = new_matrix_index[iEl];
          new_iEl = this->start_[iCol + 1] - length[iCol];
          length[iCol]--;
          this->index_[new_iEl] = num_row + iNewRow;
          this->value_[new_iEl] = new_matrix_value[iEl];
        }
      }
    }
  }
  // Update the number of rows
  this->num_row_ += num_new_row;
}